

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
 __thiscall
testing::
Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
          (testing *this,
          ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *value)

{
  _Manager_type p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  RVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  SDL_Window_conflict *local_18;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = *(_Invoker_type *)
              ((long)&(value->payload)._M_t.
                      super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                      super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                      super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                      super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18);
  p_Var1 = *(_Manager_type *)
            ((long)&(value->payload)._M_t.
                    super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)
          &(value->payload)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>;
    local_38._8_8_ =
         *(undefined8 *)
          ((long)&(value->payload)._M_t.
                  super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
                  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
                  super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
                  super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8);
    *(_Manager_type *)
     ((long)&(value->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) =
         (_Manager_type)0x0;
    *(_Invoker_type *)
     ((long)&(value->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18) =
         (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  local_18 = (value->payload)._M_t.
             super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
             super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
             super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl;
  (value->payload)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl = (SDL_Window_conflict *)0x0;
  internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
  ::ReturnAction((ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
                  *)this,(ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
                          *)&local_38);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&local_38);
  RVar2.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar2.value_.
  super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>_>
          )RVar2.value_.
           super___shared_ptr<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}